

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

ZSTD_compressionParameters *
ZSTD_getCParamsFromCCtxParams
          (ZSTD_compressionParameters *__return_storage_ptr__,ZSTD_CCtx_params *CCtxParams,
          U64 srcSizeHint,size_t dictSize,ZSTD_cParamMode_e mode)

{
  ZSTD_compressionParameters cPar;
  ZSTD_compressionParameters cParams_00;
  size_t sVar1;
  undefined8 in_stack_ffffffffffffff84;
  undefined1 local_5c [24];
  ZSTD_strategy local_44;
  undefined1 local_40 [8];
  ZSTD_compressionParameters cParams;
  ZSTD_cParamMode_e mode_local;
  size_t dictSize_local;
  U64 srcSizeHint_local;
  ZSTD_CCtx_params *CCtxParams_local;
  
  dictSize_local = srcSizeHint;
  if ((srcSizeHint == 0xffffffffffffffff) && (0 < CCtxParams->srcSizeHint)) {
    dictSize_local = (size_t)CCtxParams->srcSizeHint;
  }
  cParams.targetLength = mode;
  unique0x100001a7 = dictSize;
  ZSTD_getCParams_internal
            ((ZSTD_compressionParameters *)local_5c,CCtxParams->compressionLevel,dictSize_local,
             dictSize,mode);
  local_40 = (undefined1  [8])local_5c._0_8_;
  cParams.windowLog = local_5c._8_4_;
  cParams.chainLog = local_5c._12_4_;
  cParams.hashLog = local_5c._16_4_;
  cParams.searchLog = local_5c._20_4_;
  cParams.minMatch = local_44;
  if ((CCtxParams->ldmParams).enableLdm == ZSTD_ps_enable) {
    local_40._4_4_ = SUB84(local_5c._0_8_,4);
    local_40._0_4_ = 0x1b;
  }
  ZSTD_overrideCParams((ZSTD_compressionParameters *)local_40,&CCtxParams->cParams);
  cParams_00.hashLog = cParams.hashLog;
  cParams_00.searchLog = cParams.searchLog;
  cParams_00.windowLog = cParams.windowLog;
  cParams_00.chainLog = cParams.chainLog;
  cParams_00.minMatch = cParams.minMatch;
  cParams_00.targetLength = (int)in_stack_ffffffffffffff84;
  cParams_00.strategy = (int)((ulong)in_stack_ffffffffffffff84 >> 0x20);
  sVar1 = ZSTD_checkCParams(cParams_00);
  if (sVar1 == 0) {
    cPar.hashLog = cParams.windowLog;
    cPar.searchLog = cParams.chainLog;
    cPar.windowLog = local_40._0_4_;
    cPar.chainLog = local_40._4_4_;
    cPar.minMatch = cParams.hashLog;
    cPar.targetLength = cParams.searchLog;
    cPar.strategy = cParams.minMatch;
    ZSTD_adjustCParams_internal
              (__return_storage_ptr__,cPar,dictSize_local,stack0xffffffffffffffe0,
               cParams.targetLength,CCtxParams->useRowMatchFinder);
    return __return_storage_ptr__;
  }
  __assert_fail("!ZSTD_checkCParams(cParams)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                ,0x638,
                "ZSTD_compressionParameters ZSTD_getCParamsFromCCtxParams(const ZSTD_CCtx_params *, U64, size_t, ZSTD_cParamMode_e)"
               );
}

Assistant:

ZSTD_compressionParameters ZSTD_getCParamsFromCCtxParams(
        const ZSTD_CCtx_params* CCtxParams, U64 srcSizeHint, size_t dictSize, ZSTD_cParamMode_e mode)
{
    ZSTD_compressionParameters cParams;
    if (srcSizeHint == ZSTD_CONTENTSIZE_UNKNOWN && CCtxParams->srcSizeHint > 0) {
      srcSizeHint = CCtxParams->srcSizeHint;
    }
    cParams = ZSTD_getCParams_internal(CCtxParams->compressionLevel, srcSizeHint, dictSize, mode);
    if (CCtxParams->ldmParams.enableLdm == ZSTD_ps_enable) cParams.windowLog = ZSTD_LDM_DEFAULT_WINDOW_LOG;
    ZSTD_overrideCParams(&cParams, &CCtxParams->cParams);
    assert(!ZSTD_checkCParams(cParams));
    /* srcSizeHint == 0 means 0 */
    return ZSTD_adjustCParams_internal(cParams, srcSizeHint, dictSize, mode, CCtxParams->useRowMatchFinder);
}